

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

string * __thiscall Catch::Matchers::IsNaNMatcher::describe_abi_cxx11_(IsNaNMatcher *this)

{
  string *in_RDI;
  size_t in_stack_00000020;
  char *in_stack_00000028;
  
  s_abi_cxx11_(in_stack_00000028,in_stack_00000020);
  return in_RDI;
}

Assistant:

std::string IsNaNMatcher::describe() const {
    using namespace std::string_literals;
    return "is NaN"s;
}